

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

void __thiscall cmCacheManager::CacheEntry::SetProperty(CacheEntry *this,string *prop,char *value)

{
  char *pcVar1;
  int iVar2;
  CacheEntryType CVar3;
  size_t sVar4;
  char *pcVar5;
  string local_40;
  
  iVar2 = std::__cxx11::string::compare((char *)prop);
  if (iVar2 == 0) {
    pcVar5 = "STRING";
    if (value != (char *)0x0) {
      pcVar5 = value;
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar4 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,pcVar5,pcVar5 + sVar4);
    CVar3 = cmState::StringToCacheEntryType(&local_40);
    this->Type = CVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  iVar2 = std::__cxx11::string::compare((char *)prop);
  if (iVar2 != 0) {
    cmPropertyMap::SetProperty(&this->Properties,prop,value);
    return;
  }
  pcVar5 = "";
  if (value != (char *)0x0) {
    pcVar5 = value;
  }
  pcVar1 = (char *)(this->Value)._M_string_length;
  strlen(pcVar5);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)pcVar5);
  return;
}

Assistant:

void cmCacheManager::CacheEntry::SetProperty(const std::string& prop,
                                             const char* value)
{
  if (prop == "TYPE") {
    this->Type = cmState::StringToCacheEntryType(value ? value : "STRING");
  } else if (prop == "VALUE") {
    this->Value = value ? value : "";
  } else {
    this->Properties.SetProperty(prop, value);
  }
}